

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O0

void __thiscall CovarianceMatrix::~CovarianceMatrix(CovarianceMatrix *this)

{
  CovarianceMatrix *in_RDI;
  
  ~CovarianceMatrix(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

CovarianceMatrix::~CovarianceMatrix()
{
    delete[] _queryRootIndex;
}